

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int N;
  int iVar1;
  bool bVar2;
  _Vector_base<float,_std::allocator<float>_> local_78;
  _Vector_base<float,_std::allocator<float>_> local_60;
  undefined1 auStack_48 [8];
  vector<float,_std::allocator<float>_> pt;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cerr,"Must include a number!!\n");
  }
  else {
    N = atoi(argv[1]);
    pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    auStack_48 = (undefined1  [8])0x0;
    pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    iVar1 = 10;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      CreateRandomPoint((vector<float,_std::allocator<float>_> *)&local_78,N);
      std::vector<float,_std::allocator<float>_>::_M_move_assign
                ((vector<float,_std::allocator<float>_> *)auStack_48,&local_78);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_78);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_60,
                 (vector<float,_std::allocator<float>_> *)auStack_48);
      print((vector<float,_std::allocator<float>_> *)&local_60);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_60);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)auStack_48);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	
    int n; // dimension of the point space
	const int M = 10; //number of points to generate
    
    if( argc < 2)
    {
        std::cerr<< "Must include a number!!\n";
        return 0;
    }
    n = std::atoi( argv[1] );
	
	//create list of M random points
	std::vector<numType> pt;
	for(auto i=0; i < M ; i++)
	{
		pt = CreateRandomPoint(n);
		print( pt );	
	}
}